

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile.cc
# Opt level: O0

void __thiscall brown::Tile::drawcircfill(Tile *this,int xc,int yc,int r,uint32_t col)

{
  double dVar1;
  undefined4 local_28;
  int y;
  int i;
  uint32_t col_local;
  int r_local;
  int yc_local;
  int xc_local;
  Tile *this_local;
  
  for (local_28 = yc - r; local_28 <= yc + r; local_28 = local_28 + 1) {
    dVar1 = sqrt((double)(r * r - (yc - local_28) * (yc - local_28)));
    drawhlin(this,xc - (int)dVar1,xc + (int)dVar1,local_28,col);
  }
  return;
}

Assistant:

void Tile::drawcircfill (int xc, int yc, int r, std::uint32_t col)
{
    int i, y;
    for(y=yc-r;y<=yc+r;y++)
    {
        i = (int)sqrt((double)(r*r - (yc-y)*(yc-y)));
        this->drawhlin(xc-i,xc+i,y,col);
    }
}